

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O0

void __thiscall
spdlog::sinks::base_sink<std::mutex>::set_pattern(base_sink<std::mutex> *this,string *pattern)

{
  undefined8 in_RSI;
  lock_guard<std::mutex> *in_RDI;
  lock_guard<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffffc8;
  
  std::lock_guard<std::mutex>::lock_guard(in_RDI,in_stack_ffffffffffffffc8);
  (**(code **)((long)&in_RDI->_M_device[1].super___mutex_base._M_mutex + 0x18))(in_RDI,in_RSI);
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1ae1c5);
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::set_pattern(const std::string &pattern)
{
    std::lock_guard<Mutex> lock(mutex_);
    set_pattern_(pattern);
}